

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

wchar_t setup_current_filesystem(archive_read_disk *a)

{
  tree *t_00;
  wchar_t wVar1;
  char *__file;
  int *piVar2;
  wchar_t local_114;
  wchar_t fd;
  wchar_t xr;
  wchar_t vr;
  wchar_t r;
  statvfs svfs;
  statfs sfs;
  tree *t;
  archive_read_disk *a_local;
  
  t_00 = a->tree;
  local_114 = L'\0';
  wVar1 = tree_current_is_symblic_link_target(t_00);
  if (wVar1 == L'\0') {
    wVar1 = tree_current_dir_fd(t_00);
    fd = fstatvfs(wVar1,(statvfs *)&vr);
    wVar1 = tree_current_dir_fd(t_00);
    xr = fstatfs(wVar1,(statfs *)(svfs.__f_spare + 4));
    if (xr == L'\0') {
      wVar1 = tree_current_dir_fd(t_00);
      local_114 = get_xfer_size(t_00,wVar1,(char *)0x0);
    }
  }
  else {
    wVar1 = tree_current_dir_fd(t_00);
    __file = tree_current_access_path(t_00);
    wVar1 = openat(wVar1,__file,0x80000);
    __archive_ensure_cloexec_flag(wVar1);
    if (wVar1 < L'\0') {
      piVar2 = __errno_location();
      archive_set_error(&a->archive,*piVar2,"openat failed");
      return L'\xffffffe7';
    }
    fd = fstatvfs(wVar1,(statvfs *)&vr);
    xr = fstatfs(wVar1,(statfs *)(svfs.__f_spare + 4));
    if (xr == L'\0') {
      local_114 = get_xfer_size(t_00,wVar1,(char *)0x0);
    }
    close(wVar1);
  }
  if (((xr == L'\xffffffff') || (local_114 == L'\xffffffff')) || (fd == L'\xffffffff')) {
    t_00->current_filesystem->synthetic = -1;
    t_00->current_filesystem->remote = -1;
    piVar2 = __errno_location();
    archive_set_error(&a->archive,*piVar2,"statfs failed");
    return L'\xffffffe7';
  }
  if (local_114 == L'\x01') {
    t_00->current_filesystem->xfer_align = svfs.f_bsize;
    t_00->current_filesystem->max_xfer_size = -1;
    t_00->current_filesystem->min_xfer_size = _vr;
    t_00->current_filesystem->incr_xfer_size = _vr;
  }
  if (svfs.__f_spare._16_8_ == 0x1373) {
LAB_0079ed99:
    t_00->current_filesystem->remote = 0;
    t_00->current_filesystem->synthetic = 1;
  }
  else {
    if (((svfs.__f_spare._16_8_ != 0x517b) && (svfs.__f_spare._16_8_ != 0x564c)) &&
       (svfs.__f_spare._16_8_ != 0x6969)) {
      if ((svfs.__f_spare._16_8_ == 0x9fa0) || (svfs.__f_spare._16_8_ == 0x9fa2)) goto LAB_0079ed99;
      if (((svfs.__f_spare._16_8_ != 0x5346414f) && (svfs.__f_spare._16_8_ != 0x73757245)) &&
         (svfs.__f_spare._16_8_ != 0xff534d42)) {
        t_00->current_filesystem->remote = 0;
        t_00->current_filesystem->synthetic = 0;
        goto LAB_0079ede3;
      }
    }
    t_00->current_filesystem->remote = 1;
    t_00->current_filesystem->synthetic = 0;
  }
LAB_0079ede3:
  if ((svfs.f_fsid & 0x400) == 0) {
    t_00->current_filesystem->noatime = 0;
  }
  else {
    t_00->current_filesystem->noatime = 1;
  }
  t_00->current_filesystem->name_max = (size_t)sfs.f_fsid.__val;
  return L'\0';
}

Assistant:

static int
setup_current_filesystem(struct archive_read_disk *a)
{
	struct tree *t = a->tree;
	struct statfs sfs;
	struct statvfs svfs;
	int r, vr = 0, xr = 0;

	if (tree_current_is_symblic_link_target(t)) {
#if defined(HAVE_OPENAT)
		/*
		 * Get file system statistics on any directory
		 * where current is.
		 */
		int fd = openat(tree_current_dir_fd(t),
		    tree_current_access_path(t), O_RDONLY | O_CLOEXEC);
		__archive_ensure_cloexec_flag(fd);
		if (fd < 0) {
			archive_set_error(&a->archive, errno,
			    "openat failed");
			return (ARCHIVE_FAILED);
		}
		vr = fstatvfs(fd, &svfs);/* for f_flag, mount flags */
		r = fstatfs(fd, &sfs);
		if (r == 0)
			xr = get_xfer_size(t, fd, NULL);
		close(fd);
#else
		if (tree_enter_working_dir(t) != 0) {
			archive_set_error(&a->archive, errno, "fchdir failed");
			return (ARCHIVE_FAILED);
		}
		vr = statvfs(tree_current_access_path(t), &svfs);
		r = statfs(tree_current_access_path(t), &sfs);
		if (r == 0)
			xr = get_xfer_size(t, -1, tree_current_access_path(t));
#endif
	} else {
#ifdef HAVE_FSTATFS
		vr = fstatvfs(tree_current_dir_fd(t), &svfs);
		r = fstatfs(tree_current_dir_fd(t), &sfs);
		if (r == 0)
			xr = get_xfer_size(t, tree_current_dir_fd(t), NULL);
#else
		if (tree_enter_working_dir(t) != 0) {
			archive_set_error(&a->archive, errno, "fchdir failed");
			return (ARCHIVE_FAILED);
		}
		vr = statvfs(".", &svfs);
		r = statfs(".", &sfs);
		if (r == 0)
			xr = get_xfer_size(t, -1, ".");
#endif
	}
	if (r == -1 || xr == -1 || vr == -1) {
		t->current_filesystem->synthetic = -1;
		t->current_filesystem->remote = -1;
		archive_set_error(&a->archive, errno, "statfs failed");
		return (ARCHIVE_FAILED);
	} else if (xr == 1) {
		/* pathconf(_PC_REX_*) operations are not supported. */
		t->current_filesystem->xfer_align = svfs.f_frsize;
		t->current_filesystem->max_xfer_size = -1;
		t->current_filesystem->min_xfer_size = svfs.f_bsize;
		t->current_filesystem->incr_xfer_size = svfs.f_bsize;
	}
	switch (sfs.f_type) {
	case AFS_SUPER_MAGIC:
	case CIFS_SUPER_MAGIC:
	case CODA_SUPER_MAGIC:
	case NCP_SUPER_MAGIC:/* NetWare */
	case NFS_SUPER_MAGIC:
	case SMB_SUPER_MAGIC:
		t->current_filesystem->remote = 1;
		t->current_filesystem->synthetic = 0;
		break;
	case DEVFS_SUPER_MAGIC:
	case PROC_SUPER_MAGIC:
	case USBDEVICE_SUPER_MAGIC:
		t->current_filesystem->remote = 0;
		t->current_filesystem->synthetic = 1;
		break;
	default:
		t->current_filesystem->remote = 0;
		t->current_filesystem->synthetic = 0;
		break;
	}

#if defined(ST_NOATIME)
	if (svfs.f_flag & ST_NOATIME)
		t->current_filesystem->noatime = 1;
	else
#endif
		t->current_filesystem->noatime = 0;

#if defined(HAVE_READDIR_R)
	/* Set maximum filename length. */
	t->current_filesystem->name_max = sfs.f_namelen;
#endif
	return (ARCHIVE_OK);
}